

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
pbrt::ShapeHandle::Create
          (string *name,Transform *renderFromObject,Transform *objectFromRender,
          bool reverseOrientation,ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  initializer_list<pbrt::ShapeHandle> init;
  initializer_list<pbrt::ShapeHandle> init_00;
  initializer_list<pbrt::ShapeHandle> init_01;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  uint uVar4;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *in_RDI;
  byte in_R8B;
  Allocator in_R9;
  long *in_FS_OFFSET;
  FileLoc *in_stack_00000030;
  ParameterDictionary *in_stack_00000038;
  bool in_stack_00000047;
  Transform *in_stack_00000048;
  Transform *in_stack_00000050;
  Allocator in_stack_00000058;
  TriangleMesh *mesh_4;
  string scheme;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> P;
  vector<int,_std::allocator<int>_> vertexIndices;
  int nLevels;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> quadMesh;
  BilinearPatchMesh *mesh_3;
  TriangleMesh *mesh_2;
  TriQuadMesh plyMesh;
  string filename;
  TriangleMesh *mesh_1;
  BilinearPatchMesh *mesh;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *shapes;
  int in_stack_000009f0;
  undefined1 in_stack_000009f7;
  Transform *in_stack_000009f8;
  Allocator in_stack_00000a00;
  span<const_int> in_stack_00000a08;
  span<const_pbrt::Point3<float>_> in_stack_00000a20;
  Sphere *in_stack_fffffffffffff9a8;
  TriQuadMesh *in_stack_fffffffffffff9b0;
  ParameterDictionary *in_stack_fffffffffffff9b8;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
  *in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9cc;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  TriangleMesh *in_stack_fffffffffffff9e0;
  allocator<char> *in_stack_fffffffffffff9e8;
  Transform *in_stack_fffffffffffff9f0;
  string *in_stack_fffffffffffff9f8;
  string *def;
  string *in_stack_fffffffffffffa00;
  ParameterDictionary *in_stack_fffffffffffffa08;
  ParameterDictionary *this;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *in_stack_fffffffffffffa10;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  undefined7 in_stack_fffffffffffffa38;
  undefined1 in_stack_fffffffffffffa3f;
  Allocator in_stack_fffffffffffffa40;
  string *in_stack_fffffffffffffa48;
  FileLoc *in_stack_fffffffffffffac8;
  undefined7 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad7;
  undefined8 in_stack_fffffffffffffad8;
  Transform *in_stack_fffffffffffffae0;
  undefined7 in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaef;
  Allocator in_stack_fffffffffffffaf0;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *pvStack_4a8;
  allocator<char> local_481;
  string local_480 [24];
  string *in_stack_fffffffffffffb98;
  undefined1 local_459 [33];
  string local_438 [39];
  undefined1 local_411 [64];
  allocator<char> local_3d1;
  string local_3d0 [63];
  allocator<char> local_391;
  string local_390 [24];
  FileLoc *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  undefined8 in_stack_fffffffffffffc98;
  undefined1 reverseOrientation_00;
  polymorphic_allocator<pbrt::ShapeHandle> in_stack_fffffffffffffca0;
  Allocator in_stack_fffffffffffffca8;
  undefined1 local_2b8 [103];
  allocator<char> local_251;
  string local_250 [39];
  allocator<char> local_229;
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [80];
  TriangleMesh *local_198;
  BilinearPatchMesh *local_138;
  undefined1 local_120 [8];
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_d8 [8];
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_90 [8];
  undefined1 *local_88;
  undefined8 local_80;
  FileLoc *in_stack_ffffffffffffffa8;
  ParameterDictionary *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffbf;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar5;
  Transform *pTVar6;
  
  reverseOrientation_00 = (undefined1)((ulong)in_stack_fffffffffffffc98 >> 0x38);
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffad8 >> 0x38);
  uVar5 = 0;
  pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pbrt::ShapeHandle> *)in_stack_fffffffffffff9b0,
             (polymorphic_allocator<std::byte> *)in_stack_fffffffffffff9a8);
  pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::vector
            (in_RDI,(polymorphic_allocator<pbrt::ShapeHandle> *)&stack0xffffffffffffffb8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8);
  if (bVar1) {
    Sphere::Create((Transform *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                   in_stack_fffffffffffffae0,(bool)uVar3,
                   (ParameterDictionary *)
                   CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                   in_stack_fffffffffffffac8,in_stack_fffffffffffffaf0);
    TaggedPointer<pbrt::Sphere>((ShapeHandle *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    local_88 = local_90;
    local_80 = 1;
    pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>::polymorphic_allocator
              ((polymorphic_allocator<pbrt::ShapeHandle> *)in_stack_fffffffffffff9b0);
    init._M_array._4_4_ = in_stack_fffffffffffff9cc;
    init._M_array._0_4_ = in_stack_fffffffffffff9c8;
    init._M_len = (size_type)in_stack_fffffffffffff9d0;
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::vector
              (in_stack_fffffffffffff9c0,init,
               (polymorphic_allocator<pbrt::ShapeHandle> *)in_stack_fffffffffffff9b8);
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::operator=
              ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
               CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               in_stack_fffffffffffff9c0);
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::~vector
              ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
               in_stack_fffffffffffff9b0);
    *(long *)(*in_FS_OFFSET + -0x460) = *(long *)(*in_FS_OFFSET + -0x460) + 1;
  }
  else {
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8);
    if ((bool)uVar2) {
      Cylinder::Create((Transform *)CONCAT17(uVar2,in_stack_fffffffffffffae8),
                       in_stack_fffffffffffffae0,(bool)uVar3,
                       (ParameterDictionary *)
                       CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                       in_stack_fffffffffffffac8,in_stack_fffffffffffffaf0);
      TaggedPointer<pbrt::Cylinder>
                ((ShapeHandle *)in_stack_fffffffffffff9b0,(Cylinder *)in_stack_fffffffffffff9a8);
      local_d0 = local_d8;
      local_c8 = 1;
      pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>::polymorphic_allocator
                ((polymorphic_allocator<pbrt::ShapeHandle> *)in_stack_fffffffffffff9b0);
      init_00._M_array._4_4_ = in_stack_fffffffffffff9cc;
      init_00._M_array._0_4_ = in_stack_fffffffffffff9c8;
      init_00._M_len = (size_type)in_stack_fffffffffffff9d0;
      pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::vector
                (in_stack_fffffffffffff9c0,init_00,
                 (polymorphic_allocator<pbrt::ShapeHandle> *)in_stack_fffffffffffff9b8);
      pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
      operator=((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
                CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                in_stack_fffffffffffff9c0);
      pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::~vector
                ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
                 in_stack_fffffffffffff9b0);
      *(long *)(*in_FS_OFFSET + -0x458) = *(long *)(*in_FS_OFFSET + -0x458) + 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8);
      if (bVar1) {
        Disk::Create((Transform *)CONCAT17(uVar2,in_stack_fffffffffffffae8),
                     in_stack_fffffffffffffae0,(bool)uVar3,
                     (ParameterDictionary *)CONCAT17(bVar1,in_stack_fffffffffffffad0),
                     in_stack_fffffffffffffac8,in_stack_fffffffffffffaf0);
        TaggedPointer<pbrt::Disk>
                  ((ShapeHandle *)in_stack_fffffffffffff9b0,(Disk *)in_stack_fffffffffffff9a8);
        local_118 = local_120;
        local_110 = 1;
        pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>::polymorphic_allocator
                  ((polymorphic_allocator<pbrt::ShapeHandle> *)in_stack_fffffffffffff9b0);
        init_01._M_array._4_4_ = in_stack_fffffffffffff9cc;
        init_01._M_array._0_4_ = in_stack_fffffffffffff9c8;
        init_01._M_len = (size_type)in_stack_fffffffffffff9d0;
        pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
        vector(in_stack_fffffffffffff9c0,init_01,
               (polymorphic_allocator<pbrt::ShapeHandle> *)in_stack_fffffffffffff9b8);
        pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
        operator=((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
                  )CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                  in_stack_fffffffffffff9c0);
        pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
        ~vector((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
                in_stack_fffffffffffff9b0);
        *(long *)(*in_FS_OFFSET + -0x450) = *(long *)(*in_FS_OFFSET + -0x450) + 1;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8);
        if (bVar1) {
          local_138 = BilinearPatch::CreateMesh
                                ((Transform *)CONCAT17(uVar5,in_stack_ffffffffffffffc0),
                                 (bool)in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb0,
                                 in_stack_ffffffffffffffa8,in_R9);
          BilinearPatch::CreatePatches
                    ((BilinearPatchMesh *)
                     CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                     in_stack_fffffffffffffa40);
          pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
          operator=((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                     *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                    in_stack_fffffffffffff9c0);
          pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
          ~vector((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
                  )in_stack_fffffffffffff9b0);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8);
          if (bVar1) {
            Curve::Create(in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000038,
                          in_stack_00000030,in_stack_00000058);
            pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
            operator=((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                       *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                      in_stack_fffffffffffff9c0);
            pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
            ~vector((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                     *)in_stack_fffffffffffff9b0);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8);
            if (bVar1) {
              local_198 = Triangle::CreateMesh
                                    ((Transform *)in_stack_fffffffffffffca0.memoryResource,
                                     (bool)reverseOrientation_00,
                                     (ParameterDictionary *)
                                     CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                     in_stack_fffffffffffffc88,in_stack_fffffffffffffca8);
              Triangle::CreateTriangles
                        ((TriangleMesh *)
                         CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                         in_stack_fffffffffffffa40);
              pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
              ::operator=((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                           *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                          in_stack_fffffffffffff9c0);
              pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
              ::~vector((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                         *)in_stack_fffffffffffff9b0);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8
                                     );
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
                           (allocator<char> *)in_stack_fffffffffffff9e0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
                           (allocator<char> *)in_stack_fffffffffffff9e0);
                ParameterDictionary::GetOneString
                          (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
                           in_stack_fffffffffffff9f8);
                ResolveFilename(in_stack_fffffffffffffa48);
                std::__cxx11::string::~string(local_208);
                std::__cxx11::string::~string(local_250);
                std::allocator<char>::~allocator(&local_251);
                std::__cxx11::string::~string(local_228);
                std::allocator<char>::~allocator(&local_229);
                TriQuadMesh::ReadPLY(in_stack_fffffffffffffb98);
                bVar1 = std::vector<int,_std::allocator<int>_>::empty
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c0);
                if (!bVar1) {
                  std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::vector
                            ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *
                             )0x79ac4f);
                  in_stack_fffffffffffff9b0 = (TriQuadMesh *)local_2b8;
                  pstd::pmr::polymorphic_allocator<std::byte>::
                  new_object<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>&,std::vector<int,std::allocator<int>>&>
                            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff9f8,
                             in_stack_fffffffffffff9f0,(bool *)in_stack_fffffffffffff9e8,
                             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9e0,
                             (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                             CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                             (vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *
                             )in_stack_fffffffffffff9d0,in_stack_fffffffffffffa10,
                             (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                             in_stack_fffffffffffffa18,
                             (vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
                  std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::~vector
                            ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *
                             )in_stack_fffffffffffff9c0);
                  Triangle::CreateTriangles
                            ((TriangleMesh *)
                             CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                             in_stack_fffffffffffffa40);
                  pstd::
                  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                  operator=((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                             *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                            in_stack_fffffffffffff9c0);
                  pstd::
                  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                  ~vector((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                           *)in_stack_fffffffffffff9b0);
                }
                bVar1 = std::vector<int,_std::allocator<int>_>::empty
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c0);
                if (!bVar1) {
                  in_stack_fffffffffffff9b0 = (TriQuadMesh *)(local_2b8 + 0x18);
                  pstd::pmr::polymorphic_allocator<std::byte>::
                  new_object<pbrt::BilinearPatchMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>&,std::vector<int,std::allocator<int>>&,decltype(nullptr)>
                            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff9f8,
                             in_stack_fffffffffffff9f0,(bool *)in_stack_fffffffffffff9e8,
                             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9e0,
                             (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                             CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                             in_stack_fffffffffffff9d0,
                             (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                             in_stack_fffffffffffffa10,in_stack_fffffffffffffa18,
                             (void **)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20))
                  ;
                  BilinearPatch::CreatePatches
                            ((BilinearPatchMesh *)
                             CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                             in_stack_fffffffffffffa40);
                  pstd::
                  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                  end(in_RDI);
                  pstd::
                  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                  begin((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                         *)&stack0xfffffffffffffca0);
                  pstd::
                  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                  end((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                       *)&stack0xfffffffffffffca0);
                  pstd::
                  vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>>::
                  insert<pbrt::ShapeHandle*>
                            ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                              *)in_stack_fffffffffffff9e0,
                             (const_iterator)
                             CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                             (ShapeHandle *)in_stack_fffffffffffff9d0,
                             (ShapeHandle *)
                             CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
                  pstd::
                  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                  ~vector((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                           *)in_stack_fffffffffffff9b0);
                }
                TriQuadMesh::~TriQuadMesh(in_stack_fffffffffffff9b0);
                std::__cxx11::string::~string(local_1e8);
              }
              else {
                uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffff9b0,
                                        (char *)in_stack_fffffffffffff9a8);
                if (!(bool)uVar3) {
                  ErrorExit<std::__cxx11::string_const&>
                            ((FileLoc *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff9e0);
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
                           (allocator<char> *)in_stack_fffffffffffff9e0);
                ParameterDictionary::GetOneInt
                          ((ParameterDictionary *)in_stack_fffffffffffff9b0,
                           (string *)in_stack_fffffffffffff9a8,0);
                std::__cxx11::string::~string(local_390);
                std::allocator<char>::~allocator(&local_391);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
                           (allocator<char> *)in_stack_fffffffffffff9e0);
                ParameterDictionary::GetIntArray
                          (in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
                std::__cxx11::string::~string(local_3d0);
                std::allocator<char>::~allocator(&local_3d1);
                bVar1 = std::vector<int,_std::allocator<int>_>::empty
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c0);
                if (bVar1) {
                  ErrorExit((FileLoc *)in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8);
                }
                this = (ParameterDictionary *)local_411;
                pTVar6 = (Transform *)in_R9.memoryResource;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
                           (allocator<char> *)in_stack_fffffffffffff9e0);
                ParameterDictionary::GetPoint3fArray
                          (in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
                std::__cxx11::string::~string((string *)(local_411 + 1));
                std::allocator<char>::~allocator((allocator<char> *)local_411);
                in_stack_fffffffffffff9f0 = pTVar6;
                bVar1 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::
                        empty((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                              in_stack_fffffffffffff9c0);
                if (bVar1) {
                  ErrorExit((FileLoc *)in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8);
                }
                def = (string *)local_459;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
                           (allocator<char> *)in_stack_fffffffffffff9e0);
                in_stack_fffffffffffff9e8 = &local_481;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
                           (allocator<char> *)in_stack_fffffffffffff9e0);
                ParameterDictionary::GetOneString(this,(string *)in_R9.memoryResource,def);
                std::__cxx11::string::~string(local_480);
                std::allocator<char>::~allocator(&local_481);
                std::__cxx11::string::~string((string *)(local_459 + 1));
                std::allocator<char>::~allocator((allocator<char> *)local_459);
                uVar4 = (uint)(in_R8B & 1);
                pstd::span<int_const>::
                span<std::vector<int,std::allocator<int>>,void,std::vector<int,std::allocator<int>>>
                          ((span<const_int> *)in_stack_fffffffffffff9c0,
                           (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9b8);
                pstd::span<pbrt::Point3<float>const>::
                span<std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>,void,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>>
                          ((span<const_pbrt::Point3<float>_> *)in_stack_fffffffffffff9c0,
                           (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                           in_stack_fffffffffffff9b8);
                in_stack_fffffffffffff9e0 =
                     LoopSubdivide(in_stack_000009f8,(bool)in_stack_000009f7,in_stack_000009f0,
                                   in_stack_00000a08,in_stack_00000a20,in_stack_00000a00);
                Triangle::CreateTriangles
                          ((TriangleMesh *)CONCAT17(uVar3,in_stack_fffffffffffffa38),
                           in_stack_fffffffffffffa40);
                pstd::
                vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                operator=((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                           *)CONCAT44(uVar4,in_stack_fffffffffffff9c8),in_stack_fffffffffffff9c0);
                pstd::
                vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                ~vector(pvStack_4a8);
                std::__cxx11::string::~string(local_438);
                std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~vector
                          ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                           in_stack_fffffffffffff9c0);
                std::vector<int,_std::allocator<int>_>::~vector
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c0);
              }
            }
          }
        }
      }
    }
  }
  bVar1 = pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
          empty((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
                0x79b5de);
  if (!bVar1) {
    return in_RDI;
  }
  ErrorExit<std::__cxx11::string_const&>
            ((FileLoc *)in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9e0);
}

Assistant:

pstd::vector<ShapeHandle> ShapeHandle::Create(const std::string &name,
                                              const Transform *renderFromObject,
                                              const Transform *objectFromRender,
                                              bool reverseOrientation,
                                              const ParameterDictionary &parameters,
                                              const FileLoc *loc, Allocator alloc) {
    pstd::vector<ShapeHandle> shapes(alloc);
    if (name == "sphere") {
        shapes = {Sphere::Create(renderFromObject, objectFromRender, reverseOrientation,
                                 parameters, loc, alloc)};
        ++nSpheres;
    }
    // Create remaining single _Shape_ types
    else if (name == "cylinder") {
        shapes = {Cylinder::Create(renderFromObject, objectFromRender, reverseOrientation,
                                   parameters, loc, alloc)};
        ++nCylinders;
    } else if (name == "disk") {
        shapes = {Disk::Create(renderFromObject, objectFromRender, reverseOrientation,
                               parameters, loc, alloc)};
        ++nDisks;
    } else if (name == "bilinearmesh") {
        BilinearPatchMesh *mesh = BilinearPatch::CreateMesh(
            renderFromObject, reverseOrientation, parameters, loc, alloc);
        shapes = BilinearPatch::CreatePatches(mesh, alloc);
    }
    // Create multiple-_Shape_ types
    else if (name == "curve")
        shapes = Curve::Create(renderFromObject, objectFromRender, reverseOrientation,
                               parameters, loc, alloc);
    else if (name == "trianglemesh") {
        TriangleMesh *mesh = Triangle::CreateMesh(renderFromObject, reverseOrientation,
                                                  parameters, loc, alloc);
        shapes = Triangle::CreateTriangles(mesh, alloc);
    } else if (name == "plymesh") {
        std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
        TriQuadMesh plyMesh = TriQuadMesh::ReadPLY(filename);

        if (!plyMesh.triIndices.empty()) {
            TriangleMesh *mesh = alloc.new_object<TriangleMesh>(
                *renderFromObject, reverseOrientation, plyMesh.triIndices, plyMesh.p,
                std::vector<Vector3f>(), plyMesh.n, plyMesh.uv, plyMesh.faceIndices);
            shapes = Triangle::CreateTriangles(mesh, alloc);
        }

        if (!plyMesh.quadIndices.empty()) {
            BilinearPatchMesh *mesh = alloc.new_object<BilinearPatchMesh>(
                *renderFromObject, reverseOrientation, plyMesh.quadIndices, plyMesh.p,
                plyMesh.n, plyMesh.uv, plyMesh.faceIndices, nullptr /* image dist */);
            pstd::vector<ShapeHandle> quadMesh =
                BilinearPatch::CreatePatches(mesh, alloc);
            shapes.insert(shapes.end(), quadMesh.begin(), quadMesh.end());
        }
    } else if (name == "loopsubdiv") {
        int nLevels = parameters.GetOneInt("levels", 3);
        std::vector<int> vertexIndices = parameters.GetIntArray("indices");
        if (vertexIndices.empty())
            ErrorExit(loc, "Vertex indices \"indices\" not provided for "
                           "LoopSubdiv shape.");

        std::vector<Point3f> P = parameters.GetPoint3fArray("P");
        if (P.empty())
            ErrorExit(loc, "Vertex positions \"P\" not provided for LoopSubdiv shape.");

        // don't actually use this for now...
        std::string scheme = parameters.GetOneString("scheme", "loop");

        TriangleMesh *mesh = LoopSubdivide(renderFromObject, reverseOrientation, nLevels,
                                           vertexIndices, P, alloc);

        shapes = Triangle::CreateTriangles(mesh, alloc);
    } else
        ErrorExit(loc, "%s: shape type unknown.", name);

    if (shapes.empty())
        ErrorExit(loc, "%s: unable to create shape.", name);

    return shapes;
}